

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::Init(Client *this,char *ip,int portno)

{
  int iVar1;
  hostent *phVar2;
  
  iVar1 = socket(2,1,0);
  this->sockfd = iVar1;
  if (iVar1 < 0) {
    printf("ERROR opening client socket in %s!\n",(this->name)._M_dataplus._M_p);
  }
  phVar2 = gethostbyname(ip);
  this->server = (hostent *)phVar2;
  if (phVar2 == (hostent *)0x0) {
    fwrite("ERROR, no such host(Server is not live)!\n",0x29,1,_stderr);
    phVar2 = (hostent *)this->server;
  }
  (this->serv_addr).sin_family = 0;
  (this->serv_addr).sin_port = 0;
  (this->serv_addr).sin_addr = 0;
  (this->serv_addr).sin_zero[0] = '\0';
  (this->serv_addr).sin_zero[1] = '\0';
  (this->serv_addr).sin_zero[2] = '\0';
  (this->serv_addr).sin_zero[3] = '\0';
  (this->serv_addr).sin_zero[4] = '\0';
  (this->serv_addr).sin_zero[5] = '\0';
  (this->serv_addr).sin_zero[6] = '\0';
  (this->serv_addr).sin_zero[7] = '\0';
  (this->serv_addr).sin_family = 2;
  memmove(&(this->serv_addr).sin_addr,*phVar2->h_addr_list,(long)phVar2->h_length);
  (this->serv_addr).sin_port = (ushort)portno << 8 | (ushort)portno >> 8;
  iVar1 = connect(this->sockfd,(sockaddr *)&this->serv_addr,0x10);
  if (-1 < iVar1) {
    return;
  }
  printf("ERROR connecting %s to Server!\n",(this->name)._M_dataplus._M_p);
  return;
}

Assistant:

void Client::Init(char *ip, int portno)
{
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd < 0)
        printf("ERROR opening client socket in %s!\n", name.c_str());
    server = gethostbyname(ip);
    if (server == NULL)
    {
        fprintf(stderr, "ERROR, no such host(Server is not live)!\n");
        //exit(0);
    }
    bzero((char *)&serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    bcopy((char *)server->h_addr,
          (char *)&serv_addr.sin_addr.s_addr,
          server->h_length);
    serv_addr.sin_port = htons(portno);
    if (connect(sockfd, (struct sockaddr *)&serv_addr, sizeof(serv_addr)) < 0)
        printf("ERROR connecting %s to Server!\n", name.c_str());
    
}